

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastZ32R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ParseContext *ctx_00;
  char *pcVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar6;
  RepeatedField<int> *this;
  uint *puVar7;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  this = (RepeatedField<int> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  cVar1 = *ptr;
  do {
    ctx_00 = (ParseContext *)0xffffffffffffff80;
    pcVar5 = (char *)(long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                            limit_end_ + 1);
    if ((long)pcVar5 < 0) {
      aVar6.data = (long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                          limit_end_ + 2) << 7 | 0x7f;
      if ((long)aVar6 < 0) {
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                               limit_end_ + 3) << 0xe | 0x3fff);
        if ((long)data.field_0 < 0) {
          aVar6.data = ((long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                               limit_end_ + 4) << 0x15 | 0x1fffffU) & aVar6.data;
          if ((long)aVar6 < 0) {
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           (((long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream
                                                    ).limit_end_ + 5) << 0x1c | 0xfffffffU) &
                           (ulong)data.field_0);
            if ((long)data.field_0 < 0) {
              if (*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 6)
                  < '\0') {
                if (*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ +
                             7) < '\0') {
                  if (*(char *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_ < '\0'
                     ) {
                    if (*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                         buffer_end_ + 1) < '\0') {
                      ctx_00 = (ParseContext *)
                               ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_
                               + 3);
                      if ((*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                            buffer_end_ + 2) != '\x01') &&
                         (*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                           buffer_end_ + 2) < '\0')) {
                        ptr = (char *)0x0;
                        goto LAB_00295a9e;
                      }
                    }
                    else {
                      ctx_00 = (ParseContext *)
                               ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_
                               + 2);
                    }
                  }
                  else {
                    ctx_00 = (ParseContext *)
                             ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_ +
                             1);
                  }
                }
                else {
                  ctx_00 = (ParseContext *)
                           &(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_;
                }
              }
              else {
                ctx_00 = (ParseContext *)
                         ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 7);
              }
            }
            else {
              ctx_00 = (ParseContext *)
                       ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 6);
            }
          }
          else {
            ctx_00 = (ParseContext *)
                     ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 5);
          }
        }
        else {
          ctx_00 = (ParseContext *)
                   ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 4);
        }
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)data.field_0 & aVar6.data)
        ;
        ptr = (char *)ctx_00;
        aVar6.data = (uint64_t)data.field_0;
      }
      else {
        ptr = (char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 3);
      }
      pcVar5 = (char *)((ulong)pcVar5 & aVar6.data);
    }
    else {
      ptr = (char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 2);
    }
LAB_00295a9e:
    if ((ParseContext *)ptr == (ParseContext *)0x0) {
      pcVar5 = Error(msg,pcVar5,ctx_00,data,table,hasbits);
      return pcVar5;
    }
    RepeatedField<int>::Add(this,-((uint)pcVar5 & 1) ^ (uint)((ulong)pcVar5 >> 1) & 0x7fffffff);
    if ((ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar7 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar7 & 3) != 0) {
          AlignFail(puVar7);
        }
        *puVar7 = *puVar7 | (uint)hasbits;
      }
      return (char *)(ParseContext *)ptr;
    }
    if (*(char *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ != cVar1) {
      uVar2 = *(ushort *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
      uVar3 = (uint)table->fast_idx_mask & (uint)uVar2;
      if ((uVar3 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar4 = (ulong)(uVar3 & 0xfffffff8);
      pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                 (msg,ptr,ctx,
                                  (ulong)uVar2 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                  table,hasbits);
      return pcVar5;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ32R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<int32_t, uint8_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}